

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_diag.c
# Opt level: O2

int CVDiagSolve(CVodeMem cv_mem,N_Vector b,N_Vector weight,N_Vector ycur,N_Vector fcur)

{
  double dVar1;
  double *pdVar2;
  int iVar3;
  double dVar4;
  
  pdVar2 = (double *)cv_mem->cv_lmem;
  dVar4 = *pdVar2;
  dVar1 = cv_mem->cv_gamma;
  if ((dVar4 != dVar1) || (NAN(dVar4) || NAN(dVar1))) {
    N_VInv(pdVar2[1],pdVar2[1]);
    N_VAddConst(0xbff0000000000000,pdVar2[1],pdVar2[1]);
    N_VScale(dVar1 / dVar4,pdVar2[1],pdVar2[1]);
    N_VAddConst(0x3ff0000000000000,pdVar2[1],pdVar2[1]);
    iVar3 = N_VInvTest(pdVar2[1],pdVar2[1]);
    if (iVar3 == 0) {
      iVar3 = 1;
      dVar4 = -NAN;
      goto LAB_00111ad9;
    }
    *pdVar2 = cv_mem->cv_gamma;
  }
  N_VProd(b,pdVar2[1],b);
  dVar4 = 0.0;
  iVar3 = 0;
LAB_00111ad9:
  pdVar2[5] = dVar4;
  return iVar3;
}

Assistant:

static int CVDiagSolve(CVodeMem cv_mem, N_Vector b,
                       SUNDIALS_MAYBE_UNUSED N_Vector weight,
                       SUNDIALS_MAYBE_UNUSED N_Vector ycur,
                       SUNDIALS_MAYBE_UNUSED N_Vector fcur)
{
  sunbooleantype invOK;
  sunrealtype r;
  CVDiagMem cvdiag_mem;

  cvdiag_mem = (CVDiagMem)lmem;

  /* If gamma has changed, update factor in M, and save gamma value */

  if (gammasv != gamma)
  {
    r = gamma / gammasv;
#ifdef SUNDIALS_BUILD_PACKAGE_FUSED_KERNELS
    if (cv_mem->cv_usefused) { cvDiagSolve_updateM(r, M); }
    else
#endif
    {
      N_VInv(M, M);
      N_VAddConst(M, -ONE, M);
      N_VScale(r, M, M);
      N_VAddConst(M, ONE, M);
    }
    invOK = N_VInvTest(M, M);
    if (!invOK)
    {
      last_flag = CVDIAG_INV_FAIL;
      return (1);
    }
    gammasv = gamma;
  }

  /* Apply M-inverse to b */
  N_VProd(b, M, b);

  last_flag = CVDIAG_SUCCESS;
  return (0);
}